

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionDefinition.cpp
# Opt level: O0

void __thiscall Shell::FunctionDefinition::assignArgOccursData(FunctionDefinition *this,Def *updDef)

{
  Def *pDVar1;
  bool bVar2;
  uint uVar3;
  int iVar4;
  void *pvVar5;
  Term *this_00;
  uint *puVar6;
  Def **ppDVar7;
  long in_RSI;
  Term *parentTerm;
  Def *argDef;
  TermList *ts_1;
  Term *trm;
  Def *d;
  TermList t;
  int w;
  TermList *ts;
  int argIndex;
  Def *in_stack_ffffffffffffff68;
  undefined7 in_stack_ffffffffffffff70;
  byte in_stack_ffffffffffffff77;
  DHMap<int,_Shell::FunctionDefinition::Def_*,_Lib::IdentityHash,_Lib::DefaultHash>
  *in_stack_ffffffffffffff78;
  undefined7 in_stack_ffffffffffffff80;
  undefined1 in_stack_ffffffffffffff87;
  TermList *local_58;
  long local_40;
  TermList local_38;
  uint local_2c;
  TermList *local_28;
  int local_20;
  long local_10;
  
  local_10 = in_RSI;
  uVar3 = Kernel::Term::arity(*(Term **)(in_RSI + 0x10));
  if (uVar3 != 0) {
    Kernel::Term::arity(*(Term **)(local_10 + 0x10));
    pvVar5 = Lib::alloc(CONCAT17(in_stack_ffffffffffffff77,in_stack_ffffffffffffff70));
    *(void **)(local_10 + 0x38) = pvVar5;
    pvVar5 = *(void **)(local_10 + 0x38);
    uVar3 = Kernel::Term::arity(*(Term **)(local_10 + 0x10));
    memset(pvVar5,0,(ulong)uVar3);
    if ((assignArgOccursData(Shell::FunctionDefinition::Def*)::var2argIndex == '\0') &&
       (iVar4 = __cxa_guard_acquire(&assignArgOccursData(Shell::FunctionDefinition::Def*)::
                                     var2argIndex), iVar4 != 0)) {
      Lib::DHMap<unsigned_int,_unsigned_int,_Lib::IdentityHash,_Lib::DefaultHash>::DHMap
                (&assignArgOccursData::var2argIndex);
      __cxa_atexit(Lib::DHMap<unsigned_int,_unsigned_int,_Lib::IdentityHash,_Lib::DefaultHash>::
                   ~DHMap,&assignArgOccursData::var2argIndex,&__dso_handle);
      __cxa_guard_release(&assignArgOccursData(Shell::FunctionDefinition::Def*)::var2argIndex);
    }
    Lib::DHMap<unsigned_int,_unsigned_int,_Lib::IdentityHash,_Lib::DefaultHash>::reset
              (&assignArgOccursData::var2argIndex);
    local_20 = 0;
    local_28 = Kernel::Term::args(*(Term **)(local_10 + 0x10));
    while (bVar2 = Kernel::TermList::isNonEmpty((TermList *)0xb9b664), bVar2) {
      local_2c = Kernel::TermList::var(local_28);
      Lib::DHMap<unsigned_int,_unsigned_int,_Lib::IdentityHash,_Lib::DefaultHash>::insert
                ((DHMap<unsigned_int,_unsigned_int,_Lib::IdentityHash,_Lib::DefaultHash> *)
                 CONCAT17(in_stack_ffffffffffffff87,in_stack_ffffffffffffff80),
                 (uint)((ulong)in_stack_ffffffffffffff78 >> 0x20),(uint)in_stack_ffffffffffffff78);
      local_20 = local_20 + 1;
      local_28 = Kernel::TermList::next(local_28);
    }
    Kernel::TermList::TermList
              ((TermList *)CONCAT17(in_stack_ffffffffffffff77,in_stack_ffffffffffffff70),
               (Term *)in_stack_ffffffffffffff68);
    if ((assignArgOccursData(Shell::FunctionDefinition::Def*)::stack == '\0') &&
       (iVar4 = __cxa_guard_acquire(&assignArgOccursData(Shell::FunctionDefinition::Def*)::stack),
       iVar4 != 0)) {
      Lib::Stack<Kernel::TermList_*>::Stack
                ((Stack<Kernel::TermList_*> *)
                 CONCAT17(in_stack_ffffffffffffff87,in_stack_ffffffffffffff80),
                 (size_t)in_stack_ffffffffffffff78);
      __cxa_atexit(Lib::Stack<Kernel::TermList_*>::~Stack,&assignArgOccursData::stack,&__dso_handle)
      ;
      __cxa_guard_release(&assignArgOccursData(Shell::FunctionDefinition::Def*)::stack);
    }
    if ((assignArgOccursData(Shell::FunctionDefinition::Def*)::defArgStack == '\0') &&
       (iVar4 = __cxa_guard_acquire(&assignArgOccursData(Shell::FunctionDefinition::Def*)::
                                     defArgStack), iVar4 != 0)) {
      Lib::Stack<Shell::FunctionDefinition::Def_*>::Stack
                ((Stack<Shell::FunctionDefinition::Def_*> *)
                 CONCAT17(in_stack_ffffffffffffff87,in_stack_ffffffffffffff80),
                 (size_t)in_stack_ffffffffffffff78);
      __cxa_atexit(Lib::Stack<Shell::FunctionDefinition::Def_*>::~Stack,
                   &assignArgOccursData::defArgStack,&__dso_handle);
      __cxa_guard_release(&assignArgOccursData(Shell::FunctionDefinition::Def*)::defArgStack);
    }
    if ((assignArgOccursData(Shell::FunctionDefinition::Def*)::termArgStack == '\0') &&
       (iVar4 = __cxa_guard_acquire(&assignArgOccursData(Shell::FunctionDefinition::Def*)::
                                     termArgStack), iVar4 != 0)) {
      Lib::Stack<Kernel::Term_*>::Stack
                ((Stack<Kernel::Term_*> *)
                 CONCAT17(in_stack_ffffffffffffff87,in_stack_ffffffffffffff80),
                 (size_t)in_stack_ffffffffffffff78);
      __cxa_atexit(Lib::Stack<Kernel::Term_*>::~Stack,&assignArgOccursData::termArgStack,
                   &__dso_handle);
      __cxa_guard_release(&assignArgOccursData(Shell::FunctionDefinition::Def*)::termArgStack);
    }
    while( true ) {
      bVar2 = Kernel::TermList::isEmpty((TermList *)0xb9b7e5);
      if (bVar2) {
        Lib::Stack<Shell::FunctionDefinition::Def_*>::pop(&assignArgOccursData::defArgStack);
        Lib::Stack<Kernel::Term_*>::pop(&assignArgOccursData::termArgStack);
      }
      else {
        bVar2 = Kernel::TermList::isTerm((TermList *)0xb9b87b);
        if (bVar2) {
          this_00 = Kernel::TermList::term((TermList *)0xb9b88e);
          uVar3 = Kernel::Term::arity(this_00);
          if (uVar3 != 0) {
            bVar2 = Kernel::Term::isSort((Term *)0xb9b8b0);
            in_stack_ffffffffffffff87 = true;
            if (!bVar2) {
              Kernel::Term::functor(this_00);
              bVar2 = Lib::
                      DHMap<int,_Shell::FunctionDefinition::Def_*,_Lib::IdentityHash,_Lib::DefaultHash>
                      ::find(in_stack_ffffffffffffff78,
                             (int *)CONCAT17(in_stack_ffffffffffffff77,in_stack_ffffffffffffff70),
                             (Def **)in_stack_ffffffffffffff68);
              in_stack_ffffffffffffff87 = true;
              if (bVar2) {
                in_stack_ffffffffffffff87 = *(int *)(local_40 + 0x20) == 3;
              }
            }
            if ((bool)in_stack_ffffffffffffff87 != false) {
              local_40 = 0;
            }
            Kernel::Term::args(this_00);
            Lib::Stack<Kernel::TermList_*>::push
                      ((Stack<Kernel::TermList_*> *)
                       CONCAT17(in_stack_ffffffffffffff77,in_stack_ffffffffffffff70),
                       (TermList *)in_stack_ffffffffffffff68);
            Lib::Stack<Shell::FunctionDefinition::Def_*>::push
                      ((Stack<Shell::FunctionDefinition::Def_*> *)
                       CONCAT17(in_stack_ffffffffffffff77,in_stack_ffffffffffffff70),
                       in_stack_ffffffffffffff68);
            Lib::Stack<Kernel::Term_*>::push
                      ((Stack<Kernel::Term_*> *)
                       CONCAT17(in_stack_ffffffffffffff77,in_stack_ffffffffffffff70),
                       (Term *)in_stack_ffffffffffffff68);
          }
        }
        else {
          in_stack_ffffffffffffff78 =
               *(DHMap<int,_Shell::FunctionDefinition::Def_*,_Lib::IdentityHash,_Lib::DefaultHash>
                 **)(local_10 + 0x38);
          Kernel::TermList::var(&local_38);
          puVar6 = Lib::DHMap<unsigned_int,_unsigned_int,_Lib::IdentityHash,_Lib::DefaultHash>::get
                             ((DHMap<unsigned_int,_unsigned_int,_Lib::IdentityHash,_Lib::DefaultHash>
                               *)CONCAT17(in_stack_ffffffffffffff77,in_stack_ffffffffffffff70),
                              (uint)((ulong)in_stack_ffffffffffffff68 >> 0x20));
          *(undefined1 *)((long)&in_stack_ffffffffffffff78->_timestamp + (ulong)*puVar6) = 1;
        }
      }
      bVar2 = Lib::Stack<Kernel::TermList_*>::isEmpty(&assignArgOccursData::stack);
      if (bVar2) break;
      local_58 = Lib::Stack<Kernel::TermList_*>::pop(&assignArgOccursData::stack);
      bVar2 = Kernel::TermList::isEmpty((TermList *)0xb9b9b9);
      if (!bVar2) {
        ppDVar7 = Lib::Stack<Shell::FunctionDefinition::Def_*>::top
                            (&assignArgOccursData::defArgStack);
        pDVar1 = *ppDVar7;
        if (pDVar1 == (Def *)0x0) {
          Kernel::TermList::next(local_58);
          Lib::Stack<Kernel::TermList_*>::push
                    ((Stack<Kernel::TermList_*> *)
                     CONCAT17(in_stack_ffffffffffffff77,in_stack_ffffffffffffff70),
                     (TermList *)in_stack_ffffffffffffff68);
        }
        else {
          Lib::Stack<Kernel::Term_*>::top(&assignArgOccursData::termArgStack);
          while( true ) {
            bVar2 = Kernel::TermList::isNonEmpty((TermList *)0xb9b9ff);
            in_stack_ffffffffffffff77 = 0;
            if (bVar2) {
              in_stack_ffffffffffffff68 = (Def *)pDVar1->argOccurs;
              uVar3 = Kernel::Term::getArgumentIndex
                                ((Term *)CONCAT17(in_stack_ffffffffffffff87,
                                                  in_stack_ffffffffffffff80),
                                 (TermList *)in_stack_ffffffffffffff78);
              in_stack_ffffffffffffff77 =
                   *(bool *)((long)&in_stack_ffffffffffffff68->defCl + (ulong)uVar3) ^ 0xff;
            }
            if ((in_stack_ffffffffffffff77 & 1) == 0) break;
            local_58 = Kernel::TermList::next(local_58);
          }
          bVar2 = Kernel::TermList::isNonEmpty((TermList *)0xb9ba60);
          if (bVar2) {
            Kernel::TermList::next(local_58);
            Lib::Stack<Kernel::TermList_*>::push
                      ((Stack<Kernel::TermList_*> *)
                       CONCAT17(in_stack_ffffffffffffff77,in_stack_ffffffffffffff70),
                       (TermList *)in_stack_ffffffffffffff68);
          }
        }
      }
      local_38._content = local_58->_content;
    }
  }
  return;
}

Assistant:

void FunctionDefinition::assignArgOccursData(Def* updDef)
{
  ASS(!updDef->argOccurs);

  if(!updDef->lhs->arity()) {
    return;
  }

  updDef->argOccurs=reinterpret_cast<bool*>(ALLOC_KNOWN(updDef->lhs->arity()*sizeof(bool),
	    "FunctionDefinition::Def::argOccurs"));
  std::memset(updDef->argOccurs, 0, updDef->lhs->arity() * sizeof(bool));

  static DHMap<unsigned, unsigned, IdentityHash, DefaultHash> var2argIndex;
  var2argIndex.reset();
  int argIndex=0;
  for (TermList* ts = updDef->lhs->args(); ts->isNonEmpty(); ts=ts->next()) {
    int w = ts->var();
    var2argIndex.insert(w, argIndex);
    argIndex++;
  }

  TermList t=TermList(updDef->rhs);
  static Stack<TermList*> stack(4);
  static Stack<Def*> defArgStack(4);
  static Stack<Term*> termArgStack(4);
  for(;;) {
    Def* d;
    if(t.isEmpty()) {
      defArgStack.pop();
      termArgStack.pop();
    } else if(t.isTerm()) {
      Term* trm=t.term();
      if(trm->arity()) {
        if(trm->isSort() || !_defs.find(trm->functor(), d) || d->mark==Def::BLOCKED) {
          d=0;
        }
        ASS(!d || d->mark==Def::SAFE);
        stack.push(trm->args());
        defArgStack.push(d);
        termArgStack.push(trm);
      }
    } else {
      ASS(t.isOrdinaryVar());
      updDef->argOccurs[var2argIndex.get(t.var())]=true;
    }
    if(stack.isEmpty()) {
      break;
    }
    TermList* ts=stack.pop();
    if(!ts->isEmpty()) {
      Def* argDef=defArgStack.top();
      if(argDef) {
        Term* parentTerm=termArgStack.top();
        while(ts->isNonEmpty() && !argDef->argOccurs[parentTerm->getArgumentIndex(ts)]) {
          ts=ts->next();
        }
        if(ts->isNonEmpty()) {
          stack.push(ts->next());
        }
      } else {
        stack.push(ts->next());
      }
    }
    t=*ts;
  }
}